

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

void connection_on_io_error(void *context)

{
  int iVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (*(code **)((long)context + 0x88) != (code *)0x0) {
    (**(code **)((long)context + 0x88))(*(undefined8 *)((long)context + 0x90));
  }
  if (*(int *)((long)context + 0x10) != 0xd) {
    connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_ERROR);
    iVar1 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    if (iVar1 != 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                   ,"connection_on_io_error",0x319,1,"xio_close failed");
        return;
      }
    }
  }
  return;
}

Assistant:

static void connection_on_io_error(void* context)
{
    CONNECTION_HANDLE connection = (CONNECTION_HANDLE)context;

    /* Codes_S_R_S_CONNECTION_22_005: [If the io notifies the connection instance of an IO_STATE_ERROR state and an io error callback is registered, the connection shall call the registered callback.] */
    if (connection->on_io_error)
    {
        connection->on_io_error(connection->on_io_error_callback_context);
    }

    if (connection->connection_state != CONNECTION_STATE_END)
    {
        /* Codes_S_R_S_CONNECTION_01_202: [If the io notifies the connection instance of an IO_STATE_ERROR state the connection shall be closed and the state set to END.] */
        connection_set_state(connection, CONNECTION_STATE_ERROR);
        if (xio_close(connection->io, NULL, NULL) != 0)
        {
            LogError("xio_close failed");
        }
    }
}